

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O0

void __thiscall Assimp::MDLImporter::HandleMaterialReferences_3DGS_MDL7(MDLImporter *this)

{
  aiMesh *paVar1;
  aiMaterial *this_00;
  aiReturn aVar2;
  aiMesh *pcMesh_1;
  uint a_1;
  uint pp;
  aiMesh *pcMesh;
  uint local_18;
  uint a;
  int iIndex;
  uint i;
  MDLImporter *this_local;
  
  _iIndex = this;
  for (a = 0; a < this->pScene->mNumMaterials; a = a + 1) {
    local_18 = 0;
    aVar2 = aiGetMaterialInteger(this->pScene->mMaterials[a],"&&&referrer&&&",0,0,(int *)&local_18);
    if (aVar2 == aiReturn_SUCCESS) {
      for (pcMesh._4_4_ = 0; pcMesh._4_4_ < this->pScene->mNumMeshes;
          pcMesh._4_4_ = pcMesh._4_4_ + 1) {
        paVar1 = this->pScene->mMeshes[pcMesh._4_4_];
        if (a == paVar1->mMaterialIndex) {
          paVar1->mMaterialIndex = local_18;
        }
      }
      this_00 = this->pScene->mMaterials[a];
      if (this_00 != (aiMaterial *)0x0) {
        aiMaterial::~aiMaterial(this_00);
        operator_delete(this_00,0x10);
      }
      for (pcMesh_1._4_4_ = a; pcMesh_1._4_4_ < this->pScene->mNumMaterials - 1;
          pcMesh_1._4_4_ = pcMesh_1._4_4_ + 1) {
        this->pScene->mMaterials[pcMesh_1._4_4_] = this->pScene->mMaterials[pcMesh_1._4_4_ + 1];
        for (pcMesh_1._0_4_ = 0; (uint)pcMesh_1 < this->pScene->mNumMeshes;
            pcMesh_1._0_4_ = (uint)pcMesh_1 + 1) {
          paVar1 = this->pScene->mMeshes[(uint)pcMesh_1];
          if (a < paVar1->mMaterialIndex) {
            paVar1->mMaterialIndex = paVar1->mMaterialIndex - 1;
          }
        }
      }
      this->pScene->mNumMaterials = this->pScene->mNumMaterials - 1;
    }
  }
  return;
}

Assistant:

void MDLImporter::HandleMaterialReferences_3DGS_MDL7()
{
    // search for referrer materials
    for (unsigned int i = 0; i < pScene->mNumMaterials;++i) {
        int iIndex = 0;
        if (AI_SUCCESS == aiGetMaterialInteger(pScene->mMaterials[i],AI_MDL7_REFERRER_MATERIAL, &iIndex) )  {
            for (unsigned int a = 0; a < pScene->mNumMeshes;++a)    {
                aiMesh* const pcMesh = pScene->mMeshes[a];
                if (i == pcMesh->mMaterialIndex) {
                    pcMesh->mMaterialIndex = iIndex;
                }
            }
            // collapse the rest of the array
            delete pScene->mMaterials[i];
            for (unsigned int pp = i; pp < pScene->mNumMaterials-1;++pp)    {

                pScene->mMaterials[pp] = pScene->mMaterials[pp+1];
                for (unsigned int a = 0; a < pScene->mNumMeshes;++a)    {
                    aiMesh* const pcMesh = pScene->mMeshes[a];
                    if (pcMesh->mMaterialIndex > i)--pcMesh->mMaterialIndex;
                }
            }
            --pScene->mNumMaterials;
        }
    }
}